

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::ShaderDepthRangeTest::init(ShaderDepthRangeTest *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  ostringstream *this_00;
  ostream *poVar2;
  char *pcVar3;
  string *ctx_00;
  ostringstream src;
  allocator<char> local_1b2;
  allocator<char> local_1b1;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  this_00 = local_190;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"#version 300 es\n");
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    this_00 = (ostringstream *)std::operator<<((ostream *)local_190,"in highp vec4 a_position;\n");
    pcVar3 = "out mediump vec4 v_color;\n";
  }
  else {
    pcVar3 = "layout(location = 0) out mediump vec4 o_color;\n";
  }
  std::operator<<((ostream *)this_00,pcVar3);
  std::operator<<((ostream *)local_190,"void main (void)\n{\n");
  poVar2 = std::operator<<((ostream *)local_190,"\t");
  pcVar3 = "o_color";
  if ((this->super_ShaderRenderCase).m_isVertexCase != false) {
    pcVar3 = "v_color";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,
                  " = vec4(gl_DepthRange.near, gl_DepthRange.far, gl_DepthRange.diff*0.5 + 0.5, 1.0);\n"
                 );
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    std::operator<<((ostream *)local_190,"\tgl_Position = a_position;\n");
  }
  std::operator<<((ostream *)local_190,"}\n");
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__cxx11::stringbuf::str();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>(local_1b0,init::defaultVertSrc,&local_1b1);
  }
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__cxx11::string::string<std::allocator<char>>(local_1b0,init::defaultFragSrc,&local_1b2);
  }
  else {
    std::__cxx11::stringbuf::str();
  }
  ctx_00 = local_1b0;
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,(EVP_PKEY_CTX *)ctx_00);
  iVar1 = std::__cxx11::ostringstream::~ostringstream(local_190);
  return iVar1;
}

Assistant:

void init (void)
	{
		static const char* defaultVertSrc =
			"#version 300 es\n"
			"in highp vec4 a_position;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"}\n";
		static const char* defaultFragSrc =
			"#version 300 es\n"
			"in mediump vec4 v_color;\n"
			"layout(location = 0) out mediump vec4 o_color;\n\n"
			"void main (void)\n"
			"{\n"
			"	o_color = v_color;\n"
			"}\n";

		// Construct shader.
		std::ostringstream src;
		src << "#version 300 es\n";
		if (m_isVertexCase)
			src << "in highp vec4 a_position;\n"
				<< "out mediump vec4 v_color;\n";
		else
			src << "layout(location = 0) out mediump vec4 o_color;\n";

		src << "void main (void)\n{\n";
		src << "\t" << (m_isVertexCase ? "v_color" : "o_color") << " = vec4(gl_DepthRange.near, gl_DepthRange.far, gl_DepthRange.diff*0.5 + 0.5, 1.0);\n";

		if (m_isVertexCase)
			src << "\tgl_Position = a_position;\n";

		src << "}\n";

		m_vertShaderSource		= m_isVertexCase ? src.str()		: defaultVertSrc;
		m_fragShaderSource		= m_isVertexCase ? defaultFragSrc	: src.str();

		gls::ShaderRenderCase::init();
	}